

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

int __thiscall glslang::TIntermediate::addXfbBufferOffset(TIntermediate *this,TType *type)

{
  pointer *ppTVar1;
  bool *contains16BitType;
  iterator __position;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ulong uVar6;
  uint *puVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  TRange *pTVar11;
  ulong uVar12;
  pointer pTVar13;
  ulong uVar14;
  bool bVar15;
  TRange range;
  TRange local_38;
  long lVar5;
  
  iVar3 = (*type->_vptr_TType[0xb])(type);
  lVar5 = CONCAT44(extraout_var,iVar3);
  uVar9 = (uint)*(undefined8 *)(lVar5 + 0x24);
  if (((~uVar9 & 0x7ffc0000) == 0) || (uVar6 = (ulong)(uVar9 & 0xf), uVar6 == 0xf)) {
    __assert_fail("qualifier.hasXfbOffset() && qualifier.hasXfbBuffer()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                  ,0x80a,"int glslang::TIntermediate::addXfbBufferOffset(const TType &)");
  }
  pTVar13 = (this->xfbBuffers).
            super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
            super__Vector_impl_data._M_start;
  contains16BitType = &pTVar13[uVar6].contains16BitType;
  uVar4 = computeTypeXfbSize(this,type,&pTVar13[uVar6].contains64BitType,
                             &pTVar13[uVar6].contains32BitType,contains16BitType);
  uVar9 = (*(uint *)(lVar5 + 0x24) >> 0x12 & 0x1fff) + uVar4;
  if (uVar9 < *(uint *)(contains16BitType + -6)) {
    uVar9 = *(uint *)(contains16BitType + -6);
  }
  *(uint *)(contains16BitType + -6) = uVar9;
  uVar9 = *(uint *)(lVar5 + 0x24) >> 0x12;
  uVar10 = uVar9 & 0x1fff;
  iVar3 = uVar4 + uVar10 + -1;
  local_38 = (TRange)(CONCAT44(iVar3,uVar9) & 0xffffffff00001fff);
  puVar7 = *(uint **)&(((TXfbBuffer *)(contains16BitType + -0x22))->ranges).
                      super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl;
  __position._M_current = *(TRange **)(contains16BitType + -0x1a);
  bVar15 = (long)__position._M_current - (long)puVar7 != 0;
  puVar8 = puVar7;
  if (bVar15) {
    uVar12 = (long)__position._M_current - (long)puVar7 >> 3;
    uVar9 = *puVar7;
    if ((iVar3 < (int)uVar9) || ((int)puVar7[1] < (int)uVar10)) {
      uVar2 = 1;
      do {
        uVar14 = uVar2;
        puVar8 = puVar7;
        if (uVar12 + (uVar12 == 0) == uVar14) {
          bVar15 = uVar14 < uVar12;
          goto LAB_003706ca;
        }
        puVar7 = puVar8 + 2;
        uVar9 = puVar8[2];
        uVar2 = uVar14 + 1;
      } while ((iVar3 < (int)uVar9) || ((int)puVar8[3] < (int)uVar10));
      bVar15 = uVar14 < uVar12;
    }
    pTVar11 = &local_38;
    if ((int)uVar10 < (int)uVar9) {
      pTVar11 = (TRange *)puVar7;
    }
    puVar8 = (uint *)(ulong)*(uint *)pTVar11;
  }
LAB_003706ca:
  iVar3 = (int)puVar8;
  if (!bVar15) {
    pTVar13 = pTVar13 + uVar6;
    if (__position._M_current ==
        (pTVar13->ranges).super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<glslang::TRange,std::allocator<glslang::TRange>>::
      _M_realloc_insert<glslang::TRange_const&>
                ((vector<glslang::TRange,std::allocator<glslang::TRange>> *)pTVar13,__position,
                 &local_38);
    }
    else {
      *__position._M_current = local_38;
      ppTVar1 = &(pTVar13->ranges).
                 super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int TIntermediate::addXfbBufferOffset(const TType& type)
{
    const TQualifier& qualifier = type.getQualifier();

    assert(qualifier.hasXfbOffset() && qualifier.hasXfbBuffer());
    TXfbBuffer& buffer = xfbBuffers[qualifier.layoutXfbBuffer];

    // compute the range
    unsigned int size = computeTypeXfbSize(type, buffer.contains64BitType, buffer.contains32BitType, buffer.contains16BitType);
    buffer.implicitStride = std::max(buffer.implicitStride, qualifier.layoutXfbOffset + size);
    TRange range(qualifier.layoutXfbOffset, qualifier.layoutXfbOffset + size - 1);

    // check for collisions
    for (size_t r = 0; r < buffer.ranges.size(); ++r) {
        if (range.overlap(buffer.ranges[r])) {
            // there is a collision; pick an example to return
            return std::max(range.start, buffer.ranges[r].start);
        }
    }

    buffer.ranges.push_back(range);

    return -1;  // no collision
}